

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

void __thiscall MakefileGenerator::writeSubDirs(MakefileGenerator *this,QTextStream *t)

{
  QMakeProject *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<MakefileGenerator::SubTarget_*> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<MakefileGenerator::SubTarget_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = -0x5555555555555556;
  local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_58.ptr = (SubTarget **)0xaaaaaaaaaaaaaaaa;
  findSubDirsSubTargets((QList<MakefileGenerator::SubTarget_*> *)&local_58,this);
  QTextStream::operator<<(t,"first: make_first\n");
  this_00 = this->project;
  QString::QString((QString *)&local_70,"ordered");
  bVar1 = QMakeProject::isActiveConfig(this_00,(QString *)&local_70,false);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  local_88.d = local_58.d;
  local_88.ptr._0_4_ = local_58.ptr._0_4_;
  local_88.ptr._4_4_ = local_58.ptr._4_4_;
  local_88.size._0_4_ = (undefined4)local_58.size;
  local_88.size._4_4_ = local_58.size._4_4_;
  if (local_58.d != (Data *)0x0) {
    LOCK();
    ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[9])
            (this,t,&local_88,(ulong)((uint)bVar1 * 2 + 1));
  QArrayDataPointer<MakefileGenerator::SubTarget_*>::~QArrayDataPointer(&local_88);
  qDeleteAll<QList<MakefileGenerator::SubTarget*>>
            ((QList<MakefileGenerator::SubTarget_*> *)&local_58);
  QArrayDataPointer<MakefileGenerator::SubTarget_*>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void
MakefileGenerator::writeSubDirs(QTextStream &t)
{
    QList<SubTarget*> targets = findSubDirsSubTargets();
    t << "first: make_first\n";
    int flags = SubTargetInstalls;
    if(project->isActiveConfig("ordered"))
        flags |= SubTargetOrdered;
    writeSubTargets(t, targets, flags);
    qDeleteAll(targets);
}